

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

EmulatorEvent emulator_run_until(Emulator *e,Ticks until_ticks)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Ticks TVar5;
  ulong uVar6;
  
  if (((e->state).event & 2) != 0) {
    (e->audio_buffer).position = (e->audio_buffer).data;
  }
  check_joyp_intr(e);
  (e->state).event = 0;
  uVar6 = (ulong)(e->audio_buffer).frequency;
  lVar4 = (long)(e->audio_buffer).position - (long)(e->audio_buffer).data;
  uVar6 = ((((ulong)((e->audio_buffer).frames - (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1)) *
             0x400000 + uVar6) - 1) / uVar6 & 0xffffffff) + (e->state).apu.sync_ticks;
  TVar5 = until_ticks;
  if (uVar6 < until_ticks) {
    TVar5 = uVar6;
  }
  do {
    uVar1 = (e->state).ticks;
    if (TVar5 <= uVar1) {
      uVar3 = 0;
      break;
    }
    if ((e->state).hdma.state == DMA_INACTIVE) {
      execute_instruction(e);
    }
    else {
      (e->state).interrupt.if_ = (e->state).interrupt.new_if;
      (e->state).ticks = uVar1 + (e->state).cpu_tick;
      hdma_copy_byte(e);
      hdma_copy_byte(e);
    }
    uVar3 = (e->state).event;
  } while (uVar3 == 0);
  uVar1 = (e->state).ticks;
  if (uVar6 <= uVar1 || until_ticks <= uVar1) {
    uVar2 = uVar3 | 2;
    if (uVar1 < uVar6) {
      uVar2 = uVar3;
    }
    uVar3 = uVar2 | 4;
    if (uVar1 < until_ticks) {
      uVar3 = uVar2;
    }
    (e->state).event = uVar3;
  }
  apu_synchronize(e);
  return (e->state).event;
}

Assistant:

EmulatorEvent emulator_run_until(Emulator* e, Ticks until_ticks) {
  AudioBuffer* ab = &e->audio_buffer;
  if (e->state.event & EMULATOR_EVENT_AUDIO_BUFFER_FULL) {
    ab->position = ab->data;
  }
  check_joyp_intr(e);
  e->state.event = 0;

  u64 frames_left = ab->frames - audio_buffer_get_frames(ab);
  Ticks max_audio_ticks =
      APU.sync_ticks +
      (u32)DIV_CEIL(frames_left * CPU_TICKS_PER_SECOND, ab->frequency);
  Ticks check_ticks = MIN(until_ticks, max_audio_ticks);
  while (e->state.event == 0 && TICKS < check_ticks) {
    emulator_step_internal(e);
  }
  if (TICKS >= max_audio_ticks) {
    e->state.event |= EMULATOR_EVENT_AUDIO_BUFFER_FULL;
  }
  if (TICKS >= until_ticks) {
    e->state.event |= EMULATOR_EVENT_UNTIL_TICKS;
  }
  apu_synchronize(e);
  return e->state.event;
}